

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O2

void __thiscall bgui::ListImageWindow::updateTitle(ListImageWindow *this)

{
  int iVar1;
  keep kVar2;
  ImageAdapterBase *pIVar3;
  ostream *poVar4;
  char *local_1b0 [4];
  ostringstream os;
  
  pIVar3 = ImageWindow::getAdapter(&this->super_ImageWindow);
  if (pIVar3 != (ImageAdapterBase *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    poVar4 = std::operator<<((ostream *)&os,
                             (string *)
                             ((this->name).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + this->current));
    poVar4 = std::operator<<(poVar4," - ");
    (*pIVar3->_vptr_ImageAdapterBase[5])(pIVar3);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4,"x");
    (*pIVar3->_vptr_ImageAdapterBase[6])(pIVar3);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4,"x");
    iVar1 = (*pIVar3->_vptr_ImageAdapterBase[7])(pIVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," ");
    (*pIVar3->_vptr_ImageAdapterBase[8])(local_1b0,pIVar3);
    std::operator<<(poVar4,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    if (this->kp != keep_none) {
      std::operator<<((ostream *)&os," -");
      kVar2 = this->kp;
      if (kVar2 == keep_most) {
        poVar4 = std::operator<<((ostream *)&os," ");
        std::operator<<(poVar4,"keep");
        kVar2 = this->kp;
      }
      if (kVar2 == keep_all) {
        poVar4 = std::operator<<((ostream *)&os," ");
        std::operator<<(poVar4,"keep_all");
      }
    }
    std::__cxx11::stringbuf::str();
    BaseWindow::setTitle((BaseWindow *)this,local_1b0[0]);
    std::__cxx11::string::~string((string *)local_1b0);
    BaseWindow::setInfoText((BaseWindow *)this,"");
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    return;
  }
  ImageWindow::setAdapter
            (&this->super_ImageWindow,(ImageAdapterBase *)0x0,false,keep_none,-1,-1,false);
  BaseWindow::setTitle((BaseWindow *)this,"Image");
  BaseWindow::setInfoText((BaseWindow *)this,"No image!");
  return;
}

Assistant:

void ListImageWindow::updateTitle()
{
  ImageAdapterBase *adapt=getAdapter();

  // set image adapter and title

  if (adapt != 0)
  {
    std::ostringstream os;

    os << name[current] << " - " << adapt->getOriginalWidth() << "x" <<
       adapt->getOriginalHeight() << "x" << adapt->getOriginalDepth() <<
       " " << adapt->getOriginalType();

    if (kp != keep_none)
    {
      os << " -";

      if (kp == keep_most)
      {
        os << " " << "keep";
      }

      if (kp == keep_all)
      {
        os << " " << "keep_all";
      }
    }

    setTitle(os.str().c_str());
    setInfoText("");
  }
  else
  {
    setAdapter(0);
    setTitle("Image");
    setInfoText("No image!");
  }
}